

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O1

void __thiscall
cmInstalledFile::AppendProperty
          (cmInstalledFile *this,cmMakefile *mf,string *prop,string *value,bool param_4)

{
  pointer pcVar1;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>,std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>>>
  *this_00;
  cmGeneratorExpression ge;
  cmListFileBacktrace backtrace;
  undefined1 auStack_78 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  long local_40 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  cmMakefile::GetBacktrace(mf);
  auStack_78._8_8_ = local_30;
  local_68 = local_28;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_28->_M_use_count = local_28->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_28->_M_use_count = local_28->_M_use_count + 1;
    }
  }
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_60,(cmListFileBacktrace *)(auStack_78 + 8));
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  this_00 = (vector<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>,std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>>>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
               ::operator[](&this->Properties,prop);
  pcVar1 = (value->_M_dataplus)._M_p;
  local_50._M_allocated_capacity = (size_type)local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_60 + 0x10),pcVar1,pcVar1 + value->_M_string_length);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)auStack_78,(string *)local_60);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>,std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>>>
  ::
  emplace_back<std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>>
            (this_00,(unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      *)auStack_78);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)auStack_78);
  if ((long *)local_50._M_allocated_capacity != local_40) {
    operator_delete((void *)local_50._M_allocated_capacity,local_40[0] + 1);
  }
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_60);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

void cmInstalledFile::AppendProperty(cmMakefile const* mf,
                                     const std::string& prop,
                                     const std::string& value,
                                     bool /*asString*/)
{
  cmListFileBacktrace backtrace = mf->GetBacktrace();
  cmGeneratorExpression ge(backtrace);

  Property& property = this->Properties[prop];
  property.ValueExpressions.push_back(ge.Parse(value));
}